

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testJacobiEigenSolver<Imath_3_2::Matrix44<float>>(Matrix44<float> *A)

{
  float *pfVar1;
  float *pfVar2;
  uint __line;
  float (*pafVar3) [4];
  uint i;
  long lVar4;
  uint j;
  long lVar5;
  char *__assertion;
  BaseType_conflict2 threshold;
  float fVar6;
  float fVar7;
  TV S;
  Matrix44<float> MS;
  Matrix44<float> V;
  Matrix44<float> local_120;
  Matrix44<float> local_e0;
  Matrix44<float> MA;
  Matrix44<float> AA;
  
  threshold = computeThreshold<Imath_3_2::Matrix44<float>>(A);
  Imath_3_2::Matrix44<float>::Matrix44(&AA,A);
  V.x[0][0] = 1.0;
  V.x[0][1] = 0.0;
  V.x[0][2] = 0.0;
  V.x[0][3] = 0.0;
  V.x[1][0] = 0.0;
  V.x[1][1] = 1.0;
  V.x[1][2] = 0.0;
  V.x[1][3] = 0.0;
  V.x[2][0] = 0.0;
  V.x[2][1] = 0.0;
  V.x[2][2] = 1.0;
  V.x[2][3] = 0.0;
  V.x[3][0] = 0.0;
  V.x[3][1] = 0.0;
  V.x[3][2] = 0.0;
  V.x[3][3] = 1.0;
  Imath_3_2::jacobiEigenSolver<float>(&AA,&S,&V);
  verifyOrthonormal<Imath_3_2::Matrix44<float>>(&V,threshold);
  fVar6 = Imath_3_2::Matrix44<float>::determinant(&V);
  if (threshold <= ABS(fVar6) + -1.0) {
    __assertion = "abs (V.determinant ()) - 1 < threshold";
    __line = 0x67;
  }
  else {
    pafVar3 = (float (*) [4])&MS;
    MS.x[0][0] = 1.0;
    MS.x[0][1] = 0.0;
    MS.x[0][2] = 0.0;
    MS.x[0][3] = 0.0;
    MS.x[1][0] = 0.0;
    MS.x[1][1] = 1.0;
    MS.x[1][2] = 0.0;
    MS.x[1][3] = 0.0;
    MS.x[2][0] = 0.0;
    MS.x[2][1] = 0.0;
    MS.x[2][2] = 1.0;
    MS.x[2][3] = 0.0;
    MS.x[3][0] = 0.0;
    MS.x[3][1] = 0.0;
    MS.x[3][2] = 0.0;
    MS.x[3][3] = 1.0;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        if (lVar4 == lVar5) {
          *(undefined4 *)((long)MS.x + lVar4 * 0x14) =
               *(undefined4 *)((long)(MS.x + -1) + lVar4 * 4);
        }
        else {
          (*(float (*) [4])*pafVar3)[lVar5] = 0.0;
        }
      }
      pafVar3 = pafVar3 + 1;
    }
    fVar6 = Imath_3_2::Matrix44<float>::determinant(A);
    fVar7 = Imath_3_2::Matrix44<float>::determinant(&MS);
    if (ABS(fVar6) - ABS(fVar7) < threshold) {
      Imath_3_2::Matrix44<float>::multiply(&V,&MS);
      local_120.x[0][0] = V.x[0][0];
      local_120.x[0][1] = V.x[1][0];
      local_120.x[0][2] = V.x[2][0];
      local_120.x[0][3] = V.x[3][0];
      local_120.x[1][0] = V.x[0][1];
      local_120.x[1][1] = V.x[1][1];
      local_120.x[1][2] = V.x[2][1];
      local_120.x[1][3] = V.x[3][1];
      local_120.x[2][0] = V.x[0][2];
      local_120.x[2][1] = V.x[1][2];
      local_120.x[2][2] = V.x[2][2];
      local_120.x[2][3] = V.x[3][2];
      local_120.x[3][0] = V.x[0][3];
      local_120.x[3][1] = V.x[1][3];
      local_120.x[3][2] = V.x[2][3];
      local_120.x[3][3] = V.x[3][3];
      pafVar3 = (float (*) [4])&MA;
      Imath_3_2::Matrix44<float>::multiply(&local_e0,&local_120);
      lVar4 = 0;
      do {
        if (lVar4 == 4) {
          return;
        }
        lVar5 = 0;
        while (lVar5 != 4) {
          pfVar1 = *(float (*) [4])*(float (*) [4])A + lVar5;
          pfVar2 = *(float (*) [4])*pafVar3 + lVar5;
          lVar5 = lVar5 + 1;
          if (threshold <= ABS(*pfVar1 - *pfVar2)) {
            __assertion = "abs (A[i][j] - MA[i][j]) < threshold";
            __line = 0x79;
            goto LAB_0012ea89;
          }
        }
        lVar4 = lVar4 + 1;
        A = (Matrix44<float> *)((long)A + 0x10);
        pafVar3 = pafVar3 + 1;
      } while( true );
    }
    __assertion = "abs (A.determinant ()) - abs (MS.determinant ()) < threshold";
    __line = 0x72;
  }
LAB_0012ea89:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,__line,"void testJacobiEigenSolver(const TM &) [TM = Imath_3_2::Matrix44<float>]");
}

Assistant:

void
testJacobiEigenSolver (const TM& A)
{
    using std::abs;

    typedef typename TM::BaseType    T;
    typedef typename TM::BaseVecType TV;

    const T threshold = computeThreshold (A);

    TM AA (A);
    TV S;
    TM V;

    jacobiEigenSolver (AA, S, V);

    // Orthogonality of V
    verifyOrthonormal (V, threshold);

    // Determinant of V
    assert (abs (V.determinant ()) - 1 < threshold);

    // Determinant of A and S
    TM MS;
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                MS[i][j] = S[i];
            else
                MS[i][j] = 0;

    assert (abs (A.determinant ()) - abs (MS.determinant ()) < threshold);

    // A = V * S * V^T
    TM MA = V * MS * V.transposed ();

    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            assert (abs (A[i][j] - MA[i][j]) < threshold);
}